

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reporter.cc
# Opt level: O0

void __thiscall benchmark::JSONReporter::PrintRunData(JSONReporter *this,Run *run)

{
  ostream *poVar1;
  int64_t iVar2;
  ulong uVar3;
  allocator local_261;
  string local_260;
  string local_240;
  allocator local_219;
  string local_218;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  string local_1b0;
  allocator local_189;
  string local_188;
  string local_168;
  allocator local_141;
  string local_140;
  string local_120;
  allocator local_f9;
  string local_f8;
  string local_d8;
  allocator local_b1;
  string local_b0;
  string local_90;
  undefined8 *local_70;
  ostream *out;
  allocator local_51;
  string local_50 [8];
  string indent;
  double real_time;
  double cpu_time;
  double multiplier;
  Run *run_local;
  JSONReporter *this_local;
  
  real_time = run->cpu_accumulated_time * 1000000000.0;
  indent.field_2._8_8_ = run->real_accumulated_time * 1000000000.0;
  if (run->iterations != 0) {
    indent.field_2._8_8_ = (size_type)(indent.field_2._8_8_ / (double)run->iterations);
    real_time = real_time / (double)run->iterations;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,6,' ',&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_70 = &std::cout;
  poVar1 = std::operator<<((ostream *)&std::cout,local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"name",&local_b1);
  anon_unknown_2::FormatKV(&local_90,&local_b0,&run->benchmark_name);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  poVar1 = std::operator<<((ostream *)&std::cout,local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"iterations",&local_f9);
  anon_unknown_2::FormatKV(&local_d8,&local_f8,run->iterations);
  poVar1 = std::operator<<(poVar1,(string *)&local_d8);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  poVar1 = std::operator<<((ostream *)&std::cout,local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"real_time",&local_141);
  iVar2 = anon_unknown_2::RoundDouble((double)indent.field_2._8_8_);
  anon_unknown_2::FormatKV(&local_120,&local_140,iVar2);
  poVar1 = std::operator<<(poVar1,(string *)&local_120);
  std::operator<<(poVar1,",\n");
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  poVar1 = std::operator<<((ostream *)&std::cout,local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"cpu_time",&local_189);
  iVar2 = anon_unknown_2::RoundDouble(real_time);
  anon_unknown_2::FormatKV(&local_168,&local_188,iVar2);
  std::operator<<(poVar1,(string *)&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  if (0.0 < run->bytes_per_second) {
    poVar1 = std::operator<<((ostream *)&std::cout,",\n");
    poVar1 = std::operator<<(poVar1,local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d0,"bytes_per_second",&local_1d1);
    iVar2 = anon_unknown_2::RoundDouble(run->bytes_per_second);
    anon_unknown_2::FormatKV(&local_1b0,&local_1d0,iVar2);
    std::operator<<(poVar1,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  }
  if (0.0 < run->items_per_second) {
    poVar1 = std::operator<<((ostream *)&std::cout,",\n");
    poVar1 = std::operator<<(poVar1,local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_218,"items_per_second",&local_219);
    iVar2 = anon_unknown_2::RoundDouble(run->items_per_second);
    anon_unknown_2::FormatKV(&local_1f8,&local_218,iVar2);
    std::operator<<(poVar1,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,",\n");
    poVar1 = std::operator<<(poVar1,local_50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_260,"label",&local_261);
    anon_unknown_2::FormatKV(&local_240,&local_260,&run->report_label);
    std::operator<<(poVar1,(string *)&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
  }
  std::operator<<((ostream *)&std::cout,'\n');
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void JSONReporter::PrintRunData(Run const& run) {
    double const multiplier = 1e9; // nano second multiplier
    double cpu_time = run.cpu_accumulated_time * multiplier;
    double real_time = run.real_accumulated_time * multiplier;
    if (run.iterations != 0) {
        real_time = real_time / static_cast<double>(run.iterations);
        cpu_time = cpu_time / static_cast<double>(run.iterations);
    }

    std::string indent(6, ' ');
    std::ostream& out = std::cout;
    out << indent
        << FormatKV("name", run.benchmark_name)
        << ",\n";
    out << indent
        << FormatKV("iterations", run.iterations)
        << ",\n";
    out << indent
        << FormatKV("real_time", RoundDouble(real_time))
        << ",\n";
    out << indent
        << FormatKV("cpu_time", RoundDouble(cpu_time));
    if (run.bytes_per_second > 0.0) {
        out << ",\n" << indent
            << FormatKV("bytes_per_second", RoundDouble(run.bytes_per_second));
    }
    if (run.items_per_second > 0.0) {
        out << ",\n" << indent
            << FormatKV("items_per_second", RoundDouble(run.items_per_second));
    }
    if (!run.report_label.empty()) {
        out << ",\n" << indent
            << FormatKV("label", run.report_label);
    }
    out << '\n';
}